

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_fragment_shading_rate
          (Impl *this,Value *state,VkPipelineFragmentShadingRateStateCreateInfoKHR **out_info)

{
  undefined8 uVar1;
  bool bVar2;
  VkPipelineFragmentShadingRateStateCreateInfoKHR *pVVar3;
  Number NVar4;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar5;
  Type pGVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar7;
  bool bVar8;
  long lVar9;
  undefined8 local_30;
  
  pVVar3 = (VkPipelineFragmentShadingRateStateCreateInfoKHR *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar3 != (VkPipelineFragmentShadingRateStateCreateInfoKHR *)0x0) {
    (pVVar3->fragmentSize).width = 0;
    (pVVar3->fragmentSize).height = 0;
    pVVar3->combinerOps[0] = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
    pVVar3->combinerOps[1] = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
    *(undefined8 *)pVVar3 = 0;
    pVVar3->pNext = (void *)0x0;
  }
  *out_info = pVVar3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffd0,(Ch *)state);
  uVar1 = local_30;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (uVar1 != NVar4.i64) {
    pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)state,"fragmentSize");
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar5,"width");
    if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      (pVVar3->fragmentSize).width = (pGVar6->data_).s.length;
      pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)state,"fragmentSize");
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(pGVar5,"height");
      if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        (pVVar3->fragmentSize).height = (pGVar6->data_).s.length;
        goto LAB_00126077;
      }
    }
LAB_001260ee:
    __assert_fail("data_.f.flags & kUintFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x719,
                  "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
LAB_00126077:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffd0,(Ch *)state);
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (local_30 != NVar4.i64) {
    lVar9 = 0;
    bVar2 = true;
    do {
      bVar8 = bVar2;
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"combinerOps");
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator[](pGVar6,(SizeType)lVar9);
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_001260ee;
      pVVar3->combinerOps[lVar9] = (pGVar7->data_).s.length;
      lVar9 = 1;
      bVar2 = false;
    } while (bVar8);
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_fragment_shading_rate(const Value &state,
                                                      VkPipelineFragmentShadingRateStateCreateInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineFragmentShadingRateStateCreateInfoKHR>();
	*out_info = info;

	// Could be null for dynamic state.
	if (state.HasMember("fragmentSize"))
	{
		info->fragmentSize.width = state["fragmentSize"]["width"].GetUint();
		info->fragmentSize.height = state["fragmentSize"]["height"].GetUint();
	}

	// Could be null for dynamic state.
	if (state.HasMember("combinerOps"))
	{
		for (uint32_t i = 0; i < 2; i++)
			info->combinerOps[i] = static_cast<VkFragmentShadingRateCombinerOpKHR>(state["combinerOps"][i].GetUint());
	}

	return true;
}